

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O1

error_code __thiscall
simdjson::haswell::implementation::minify
          (implementation *this,uint8_t *buf,size_t len,uint8_t *dst,size_t *dst_len)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  error_code eVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint8_t *guarded_dst;
  undefined1 (*pauVar26) [16];
  undefined1 (*__dest) [16];
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint8_t block [128];
  uint8_t out_block [128];
  ulong local_170;
  undefined1 local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  undefined1 uStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  undefined1 uStack_130;
  undefined1 uStack_12f;
  undefined1 uStack_12e;
  undefined1 uStack_12d;
  undefined1 uStack_12c;
  undefined1 uStack_12b;
  undefined1 uStack_12a;
  undefined1 uStack_129;
  undefined1 uStack_128;
  undefined1 uStack_127;
  undefined1 uStack_126;
  undefined1 uStack_125;
  undefined1 uStack_124;
  undefined1 uStack_123;
  undefined1 uStack_122;
  undefined1 uStack_121;
  undefined1 uStack_120;
  undefined1 uStack_11f;
  undefined1 uStack_11e;
  undefined1 uStack_11d;
  undefined1 uStack_11c;
  undefined1 uStack_11b;
  undefined1 uStack_11a;
  undefined1 uStack_119;
  undefined1 local_118;
  undefined1 uStack_117;
  undefined1 uStack_116;
  undefined1 uStack_115;
  undefined1 uStack_114;
  undefined1 uStack_113;
  undefined1 uStack_112;
  undefined1 uStack_111;
  undefined1 uStack_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  undefined1 uStack_108;
  undefined1 uStack_107;
  undefined1 uStack_106;
  undefined1 uStack_105;
  undefined1 uStack_104;
  undefined1 uStack_103;
  undefined1 uStack_102;
  undefined1 uStack_101;
  undefined1 uStack_100;
  undefined1 uStack_ff;
  undefined1 uStack_fe;
  undefined1 uStack_fd;
  undefined1 uStack_fc;
  undefined1 uStack_fb;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  undefined1 uStack_e8;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  undefined1 uStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  undefined1 uStack_e0;
  undefined1 uStack_df;
  undefined1 uStack_de;
  undefined1 uStack_dd;
  undefined1 uStack_dc;
  undefined1 uStack_db;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  undefined1 local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 uStack_d0;
  undefined1 uStack_cf;
  undefined1 uStack_ce;
  undefined1 uStack_cd;
  undefined1 uStack_cc;
  undefined1 uStack_cb;
  undefined1 uStack_ca;
  undefined1 uStack_c9;
  undefined1 uStack_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 local_b8 [16];
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  undefined1 auStack_88 [88];
  
  auVar31 = _DAT_00195280;
  uVar17 = 0;
  uVar27 = 0;
  local_170 = 0;
  uVar21 = len - 0x80;
  if (len < 0x80) {
    uVar21 = uVar17;
  }
  __dest = (undefined1 (*) [16])dst;
  if (len >= 0x80 && len - 0x80 != 0) {
    local_170 = 0;
    auVar29[8] = 0x5c;
    auVar29._0_8_ = 0x5c5c5c5c5c5c5c5c;
    auVar29[9] = 0x5c;
    auVar29[10] = 0x5c;
    auVar29[0xb] = 0x5c;
    auVar29[0xc] = 0x5c;
    auVar29[0xd] = 0x5c;
    auVar29[0xe] = 0x5c;
    auVar29[0xf] = 0x5c;
    auVar29[0x10] = 0x5c;
    auVar29[0x11] = 0x5c;
    auVar29[0x12] = 0x5c;
    auVar29[0x13] = 0x5c;
    auVar29[0x14] = 0x5c;
    auVar29[0x15] = 0x5c;
    auVar29[0x16] = 0x5c;
    auVar29[0x17] = 0x5c;
    auVar29[0x18] = 0x5c;
    auVar29[0x19] = 0x5c;
    auVar29[0x1a] = 0x5c;
    auVar29[0x1b] = 0x5c;
    auVar29[0x1c] = 0x5c;
    auVar29[0x1d] = 0x5c;
    auVar29[0x1e] = 0x5c;
    auVar29[0x1f] = 0x5c;
    auVar30[8] = 0x22;
    auVar30._0_8_ = 0x2222222222222222;
    auVar30[9] = 0x22;
    auVar30[10] = 0x22;
    auVar30[0xb] = 0x22;
    auVar30[0xc] = 0x22;
    auVar30[0xd] = 0x22;
    auVar30[0xe] = 0x22;
    auVar30[0xf] = 0x22;
    auVar30[0x10] = 0x22;
    auVar30[0x11] = 0x22;
    auVar30[0x12] = 0x22;
    auVar30[0x13] = 0x22;
    auVar30[0x14] = 0x22;
    auVar30[0x15] = 0x22;
    auVar30[0x16] = 0x22;
    auVar30[0x17] = 0x22;
    auVar30[0x18] = 0x22;
    auVar30[0x19] = 0x22;
    auVar30[0x1a] = 0x22;
    auVar30[0x1b] = 0x22;
    auVar30[0x1c] = 0x22;
    auVar30[0x1d] = 0x22;
    auVar30[0x1e] = 0x22;
    auVar30[0x1f] = 0x22;
    auVar32 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar36._16_16_ = _DAT_00190140;
    auVar36._0_16_ = _DAT_00190140;
    uVar27 = 0;
    uVar17 = 0;
    pauVar26 = (undefined1 (*) [16])dst;
    do {
      auVar46 = *(undefined1 (*) [32])(buf + uVar17);
      auVar50 = *(undefined1 (*) [32])(buf + uVar17 + 0x20);
      auVar51 = vpcmpeqb_avx2(auVar46,auVar29);
      auVar1 = vpcmpeqb_avx2(auVar50,auVar29);
      uVar15 = CONCAT44((uint)(SUB321(auVar1 >> 7,0) & 1) | (uint)(SUB321(auVar1 >> 0xf,0) & 1) << 1
                        | (uint)(SUB321(auVar1 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar1 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar1 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar1 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar1 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar1 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar1 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar1 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar1 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar1 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar1 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar1 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar1 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar1 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar1 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar1 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar1 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar1 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar1 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar1 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar1 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar1 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar1 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar1 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar1 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar1 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar1 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar1 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar1 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar1[0x1f] >> 7) << 0x1f,
                        (uint)(SUB321(auVar51 >> 7,0) & 1) |
                        (uint)(SUB321(auVar51 >> 0xf,0) & 1) << 1 |
                        (uint)(SUB321(auVar51 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar51 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar51 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar51 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar51 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar51 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar51 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar51 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar51 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar51 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar51 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar51 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar51 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar51 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar51 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar51 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar51 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar51 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar51 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar51 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar51 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar51 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar51 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar51 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar51 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar51 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar51 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar51 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar51 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar51[0x1f] >> 7) << 0x1f);
      if (uVar15 == 0) {
        uVar20 = 0;
      }
      else {
        uVar15 = ~local_170 & uVar15;
        local_170 = uVar15 * 2 | local_170;
        uVar28 = ~local_170 & uVar15 & 0xaaaaaaaaaaaaaaaa;
        uVar20 = (ulong)CARRY8(uVar28,uVar15);
        local_170 = ((uVar28 + uVar15) * 2 ^ 0x5555555555555555) & local_170;
      }
      auVar51 = *(undefined1 (*) [32])(buf + uVar17 + 0x40);
      auVar1 = *(undefined1 (*) [32])(buf + uVar17 + 0x60);
      auVar58 = vpcmpeqb_avx2(auVar46,auVar30);
      auVar59 = vpcmpeqb_avx2(auVar50,auVar30);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = ~local_170 &
                     CONCAT44((uint)(SUB321(auVar59 >> 7,0) & 1) |
                              (uint)(SUB321(auVar59 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar59 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar59 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar59 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar59 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar59 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar59 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar59 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar59 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar59 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar59 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar59 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar59 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar59 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar59 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar59 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar59 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar59 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar59 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar59 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar59 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar59 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar59 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar59 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar59 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar59 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar59 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar59 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar59 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar59 >> 0xf7,0) & 1) << 0x1e |
                              (uint)(byte)(auVar59[0x1f] >> 7) << 0x1f,
                              (uint)(SUB321(auVar58 >> 7,0) & 1) |
                              (uint)(SUB321(auVar58 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar58 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar58 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar58 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar58 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar58 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar58 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar58 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar58 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar58 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar58 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar58 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar58 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar58 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar58 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar58 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar58 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar58 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar58 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar58 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar58 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar58 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar58 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar58 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar58 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar58 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar58 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar58 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar58 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar58 >> 0xf7,0) & 1) << 0x1e |
                              (uint)(byte)(auVar58[0x1f] >> 7) << 0x1f);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auVar32._0_8_;
      auVar45 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar4 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar45 = auVar45 ^ auVar8 << uVar3;
        }
      }
      auVar58 = vpshufb_avx2(auVar36,auVar46);
      auVar59 = vpshufb_avx2(auVar36,auVar50);
      auVar58 = vpcmpeqb_avx2(auVar46,auVar58);
      auVar59 = vpcmpeqb_avx2(auVar59,auVar50);
      auVar77 = vpcmpeqb_avx2(auVar51,auVar29);
      auVar2 = vpcmpeqb_avx2(auVar1,auVar29);
      uVar15 = CONCAT44((uint)(SUB321(auVar2 >> 7,0) & 1) | (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1
                        | (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f,
                        (uint)(SUB321(auVar77 >> 7,0) & 1) |
                        (uint)(SUB321(auVar77 >> 0xf,0) & 1) << 1 |
                        (uint)(SUB321(auVar77 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar77 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar77 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar77 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar77 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar77 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar77 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar77 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar77 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar77 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar77 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar77 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar77 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar77 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar77 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar77 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar77 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar77 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar77 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar77 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar77 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar77 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar77 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar77 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar77 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar77 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar77 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar77 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar77 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar77[0x1f] >> 7) << 0x1f);
      if (uVar15 == 0) {
        local_170 = 0;
      }
      else {
        uVar28 = ~uVar20 & uVar15;
        uVar20 = uVar20 + uVar28 * 2;
        uVar15 = ~uVar20 & uVar15 & 0xaaaaaaaaaaaaaaaa;
        local_170 = (ulong)CARRY8(uVar15,uVar28);
        uVar20 = ((uVar15 + uVar28) * 2 ^ 0x5555555555555555) & uVar20;
      }
      uVar27 = auVar45._0_8_ ^ uVar27;
      auVar77 = vpcmpeqb_avx2(auVar51,auVar30);
      auVar2 = vpcmpeqb_avx2(auVar1,auVar30);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = ~uVar20 & CONCAT44((uint)(SUB321(auVar2 >> 7,0) & 1) |
                                        (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                        (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                        (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                        (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                        (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                        (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                        (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                        (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                        (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                        (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                        (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                        (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                        (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                        (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                        (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                        (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                        (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                        (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                        (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                        (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                        (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                        (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                        (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                        (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                        (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                        (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                        (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                        (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                        (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                        (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                                        (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f,
                                        (uint)(SUB321(auVar77 >> 7,0) & 1) |
                                        (uint)(SUB321(auVar77 >> 0xf,0) & 1) << 1 |
                                        (uint)(SUB321(auVar77 >> 0x17,0) & 1) << 2 |
                                        (uint)(SUB321(auVar77 >> 0x1f,0) & 1) << 3 |
                                        (uint)(SUB321(auVar77 >> 0x27,0) & 1) << 4 |
                                        (uint)(SUB321(auVar77 >> 0x2f,0) & 1) << 5 |
                                        (uint)(SUB321(auVar77 >> 0x37,0) & 1) << 6 |
                                        (uint)(SUB321(auVar77 >> 0x3f,0) & 1) << 7 |
                                        (uint)(SUB321(auVar77 >> 0x47,0) & 1) << 8 |
                                        (uint)(SUB321(auVar77 >> 0x4f,0) & 1) << 9 |
                                        (uint)(SUB321(auVar77 >> 0x57,0) & 1) << 10 |
                                        (uint)(SUB321(auVar77 >> 0x5f,0) & 1) << 0xb |
                                        (uint)(SUB321(auVar77 >> 0x67,0) & 1) << 0xc |
                                        (uint)(SUB321(auVar77 >> 0x6f,0) & 1) << 0xd |
                                        (uint)(SUB321(auVar77 >> 0x77,0) & 1) << 0xe |
                                        (uint)SUB321(auVar77 >> 0x7f,0) << 0xf |
                                        (uint)(SUB321(auVar77 >> 0x87,0) & 1) << 0x10 |
                                        (uint)(SUB321(auVar77 >> 0x8f,0) & 1) << 0x11 |
                                        (uint)(SUB321(auVar77 >> 0x97,0) & 1) << 0x12 |
                                        (uint)(SUB321(auVar77 >> 0x9f,0) & 1) << 0x13 |
                                        (uint)(SUB321(auVar77 >> 0xa7,0) & 1) << 0x14 |
                                        (uint)(SUB321(auVar77 >> 0xaf,0) & 1) << 0x15 |
                                        (uint)(SUB321(auVar77 >> 0xb7,0) & 1) << 0x16 |
                                        (uint)SUB321(auVar77 >> 0xbf,0) << 0x17 |
                                        (uint)(SUB321(auVar77 >> 199,0) & 1) << 0x18 |
                                        (uint)(SUB321(auVar77 >> 0xcf,0) & 1) << 0x19 |
                                        (uint)(SUB321(auVar77 >> 0xd7,0) & 1) << 0x1a |
                                        (uint)(SUB321(auVar77 >> 0xdf,0) & 1) << 0x1b |
                                        (uint)(SUB321(auVar77 >> 0xe7,0) & 1) << 0x1c |
                                        (uint)(SUB321(auVar77 >> 0xef,0) & 1) << 0x1d |
                                        (uint)(SUB321(auVar77 >> 0xf7,0) & 1) << 0x1e |
                                        (uint)(byte)(auVar77[0x1f] >> 7) << 0x1f);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar32._0_8_;
      auVar45 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar5 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar45 = auVar45 ^ auVar9 << uVar3;
        }
      }
      uVar28 = auVar45._0_8_ ^ (long)uVar27 >> 0x3f;
      auVar77 = vpshufb_avx2(auVar36,auVar51);
      auVar2 = vpshufb_avx2(auVar36,auVar1);
      auVar77 = vpcmpeqb_avx2(auVar77,auVar51);
      auVar2 = vpcmpeqb_avx2(auVar2,auVar1);
      uVar20 = ~uVar27 & CONCAT44((uint)(SUB321(auVar59 >> 7,0) & 1) |
                                  (uint)(SUB321(auVar59 >> 0xf,0) & 1) << 1 |
                                  (uint)(SUB321(auVar59 >> 0x17,0) & 1) << 2 |
                                  (uint)(SUB321(auVar59 >> 0x1f,0) & 1) << 3 |
                                  (uint)(SUB321(auVar59 >> 0x27,0) & 1) << 4 |
                                  (uint)(SUB321(auVar59 >> 0x2f,0) & 1) << 5 |
                                  (uint)(SUB321(auVar59 >> 0x37,0) & 1) << 6 |
                                  (uint)(SUB321(auVar59 >> 0x3f,0) & 1) << 7 |
                                  (uint)(SUB321(auVar59 >> 0x47,0) & 1) << 8 |
                                  (uint)(SUB321(auVar59 >> 0x4f,0) & 1) << 9 |
                                  (uint)(SUB321(auVar59 >> 0x57,0) & 1) << 10 |
                                  (uint)(SUB321(auVar59 >> 0x5f,0) & 1) << 0xb |
                                  (uint)(SUB321(auVar59 >> 0x67,0) & 1) << 0xc |
                                  (uint)(SUB321(auVar59 >> 0x6f,0) & 1) << 0xd |
                                  (uint)(SUB321(auVar59 >> 0x77,0) & 1) << 0xe |
                                  (uint)SUB321(auVar59 >> 0x7f,0) << 0xf |
                                  (uint)(SUB321(auVar59 >> 0x87,0) & 1) << 0x10 |
                                  (uint)(SUB321(auVar59 >> 0x8f,0) & 1) << 0x11 |
                                  (uint)(SUB321(auVar59 >> 0x97,0) & 1) << 0x12 |
                                  (uint)(SUB321(auVar59 >> 0x9f,0) & 1) << 0x13 |
                                  (uint)(SUB321(auVar59 >> 0xa7,0) & 1) << 0x14 |
                                  (uint)(SUB321(auVar59 >> 0xaf,0) & 1) << 0x15 |
                                  (uint)(SUB321(auVar59 >> 0xb7,0) & 1) << 0x16 |
                                  (uint)SUB321(auVar59 >> 0xbf,0) << 0x17 |
                                  (uint)(SUB321(auVar59 >> 199,0) & 1) << 0x18 |
                                  (uint)(SUB321(auVar59 >> 0xcf,0) & 1) << 0x19 |
                                  (uint)(SUB321(auVar59 >> 0xd7,0) & 1) << 0x1a |
                                  (uint)(SUB321(auVar59 >> 0xdf,0) & 1) << 0x1b |
                                  (uint)(SUB321(auVar59 >> 0xe7,0) & 1) << 0x1c |
                                  (uint)(SUB321(auVar59 >> 0xef,0) & 1) << 0x1d |
                                  (uint)(SUB321(auVar59 >> 0xf7,0) & 1) << 0x1e |
                                  (uint)(byte)(auVar59[0x1f] >> 7) << 0x1f,
                                  (uint)(SUB321(auVar58 >> 7,0) & 1) |
                                  (uint)(SUB321(auVar58 >> 0xf,0) & 1) << 1 |
                                  (uint)(SUB321(auVar58 >> 0x17,0) & 1) << 2 |
                                  (uint)(SUB321(auVar58 >> 0x1f,0) & 1) << 3 |
                                  (uint)(SUB321(auVar58 >> 0x27,0) & 1) << 4 |
                                  (uint)(SUB321(auVar58 >> 0x2f,0) & 1) << 5 |
                                  (uint)(SUB321(auVar58 >> 0x37,0) & 1) << 6 |
                                  (uint)(SUB321(auVar58 >> 0x3f,0) & 1) << 7 |
                                  (uint)(SUB321(auVar58 >> 0x47,0) & 1) << 8 |
                                  (uint)(SUB321(auVar58 >> 0x4f,0) & 1) << 9 |
                                  (uint)(SUB321(auVar58 >> 0x57,0) & 1) << 10 |
                                  (uint)(SUB321(auVar58 >> 0x5f,0) & 1) << 0xb |
                                  (uint)(SUB321(auVar58 >> 0x67,0) & 1) << 0xc |
                                  (uint)(SUB321(auVar58 >> 0x6f,0) & 1) << 0xd |
                                  (uint)(SUB321(auVar58 >> 0x77,0) & 1) << 0xe |
                                  (uint)SUB321(auVar58 >> 0x7f,0) << 0xf |
                                  (uint)(SUB321(auVar58 >> 0x87,0) & 1) << 0x10 |
                                  (uint)(SUB321(auVar58 >> 0x8f,0) & 1) << 0x11 |
                                  (uint)(SUB321(auVar58 >> 0x97,0) & 1) << 0x12 |
                                  (uint)(SUB321(auVar58 >> 0x9f,0) & 1) << 0x13 |
                                  (uint)(SUB321(auVar58 >> 0xa7,0) & 1) << 0x14 |
                                  (uint)(SUB321(auVar58 >> 0xaf,0) & 1) << 0x15 |
                                  (uint)(SUB321(auVar58 >> 0xb7,0) & 1) << 0x16 |
                                  (uint)SUB321(auVar58 >> 0xbf,0) << 0x17 |
                                  (uint)(SUB321(auVar58 >> 199,0) & 1) << 0x18 |
                                  (uint)(SUB321(auVar58 >> 0xcf,0) & 1) << 0x19 |
                                  (uint)(SUB321(auVar58 >> 0xd7,0) & 1) << 0x1a |
                                  (uint)(SUB321(auVar58 >> 0xdf,0) & 1) << 0x1b |
                                  (uint)(SUB321(auVar58 >> 0xe7,0) & 1) << 0x1c |
                                  (uint)(SUB321(auVar58 >> 0xef,0) & 1) << 0x1d |
                                  (uint)(SUB321(auVar58 >> 0xf7,0) & 1) << 0x1e |
                                  (uint)(byte)(auVar58[0x1f] >> 7) << 0x1f);
      uVar27 = (ulong)((uint)(uVar20 >> 0x10) & 0xff);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar20 >> 0x18 & 0xff) * 8);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
      auVar45 = vpunpcklqdq_avx(auVar70,auVar60);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar20 >> 8) & 0xff) * 8)
      ;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar20 & 0xff) * 8);
      auVar4 = vpunpcklqdq_avx(auVar78,auVar71);
      auVar67._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar4;
      auVar67._16_16_ = ZEXT116(1) * auVar45;
      auVar58 = vpaddb_avx2(auVar67,auVar31);
      auVar46 = vpshufb_avx2(auVar46,auVar58);
      auVar68._0_16_ =
           ZEXT116(0) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            ) + ZEXT116(1) *
                *(undefined1 (*) [16])
                 (internal::pshufb_combine_table +
                 (ulong)(byte)internal::BitsSetTable256mul2[uVar20 & 0xff] * 8);
      auVar68._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            );
      auVar46 = vpshufb_avx2(auVar46,auVar68);
      *pauVar26 = auVar46._0_16_;
      uVar22 = POPCOUNT((uint)uVar20);
      *(undefined1 (*) [16])((long)pauVar26 + (0x10 - (ulong)(uint)POPCOUNT((uint)uVar20 & 0xffff)))
           = auVar46._16_16_;
      uVar15 = uVar20 >> 0x30 & 0xff;
      uVar3 = (uint)(uVar20 >> 0x20);
      uVar27 = uVar20 >> 0x20 & 0xff;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar20 >> 0x38) * 8);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar15 * 8);
      auVar45 = vpunpcklqdq_avx(auVar61,auVar54);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar3 >> 8 & 0xff) * 8);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
      auVar4 = vpunpcklqdq_avx(auVar79,auVar72);
      auVar58._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar4;
      auVar58._16_16_ = ZEXT116(1) * auVar45;
      auVar46 = vpaddb_avx2(auVar58,auVar31);
      auVar46 = vpshufb_avx2(auVar50,auVar46);
      auVar59._0_16_ =
           ZEXT116(0) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar15] * 8
            ) + ZEXT116(1) *
                *(undefined1 (*) [16])
                 (internal::pshufb_combine_table +
                 (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8);
      auVar59._16_16_ =
           ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar15] * 8
            );
      auVar46 = vpshufb_avx2(auVar46,auVar59);
      *(undefined1 (*) [16])((long)pauVar26 + (0x20 - (ulong)uVar22)) = auVar46._0_16_;
      *(undefined1 (*) [16])
       ((long)pauVar26 + (-(ulong)(uint)POPCOUNT(uVar3 & 0xffff) - (ulong)uVar22) + 0x30) =
           auVar46._16_16_;
      lVar16 = POPCOUNT(~uVar20);
      uVar20 = ~uVar28 & CONCAT44((uint)(SUB321(auVar2 >> 7,0) & 1) |
                                  (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                  (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                  (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                  (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                  (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                  (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                  (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                  (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                  (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                  (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                  (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                  (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                  (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                  (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                  (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                  (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                  (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                  (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                  (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                  (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                  (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                  (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                  (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                  (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                  (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                  (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                  (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                  (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                  (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                  (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                                  (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f,
                                  (uint)(SUB321(auVar77 >> 7,0) & 1) |
                                  (uint)(SUB321(auVar77 >> 0xf,0) & 1) << 1 |
                                  (uint)(SUB321(auVar77 >> 0x17,0) & 1) << 2 |
                                  (uint)(SUB321(auVar77 >> 0x1f,0) & 1) << 3 |
                                  (uint)(SUB321(auVar77 >> 0x27,0) & 1) << 4 |
                                  (uint)(SUB321(auVar77 >> 0x2f,0) & 1) << 5 |
                                  (uint)(SUB321(auVar77 >> 0x37,0) & 1) << 6 |
                                  (uint)(SUB321(auVar77 >> 0x3f,0) & 1) << 7 |
                                  (uint)(SUB321(auVar77 >> 0x47,0) & 1) << 8 |
                                  (uint)(SUB321(auVar77 >> 0x4f,0) & 1) << 9 |
                                  (uint)(SUB321(auVar77 >> 0x57,0) & 1) << 10 |
                                  (uint)(SUB321(auVar77 >> 0x5f,0) & 1) << 0xb |
                                  (uint)(SUB321(auVar77 >> 0x67,0) & 1) << 0xc |
                                  (uint)(SUB321(auVar77 >> 0x6f,0) & 1) << 0xd |
                                  (uint)(SUB321(auVar77 >> 0x77,0) & 1) << 0xe |
                                  (uint)SUB321(auVar77 >> 0x7f,0) << 0xf |
                                  (uint)(SUB321(auVar77 >> 0x87,0) & 1) << 0x10 |
                                  (uint)(SUB321(auVar77 >> 0x8f,0) & 1) << 0x11 |
                                  (uint)(SUB321(auVar77 >> 0x97,0) & 1) << 0x12 |
                                  (uint)(SUB321(auVar77 >> 0x9f,0) & 1) << 0x13 |
                                  (uint)(SUB321(auVar77 >> 0xa7,0) & 1) << 0x14 |
                                  (uint)(SUB321(auVar77 >> 0xaf,0) & 1) << 0x15 |
                                  (uint)(SUB321(auVar77 >> 0xb7,0) & 1) << 0x16 |
                                  (uint)SUB321(auVar77 >> 0xbf,0) << 0x17 |
                                  (uint)(SUB321(auVar77 >> 199,0) & 1) << 0x18 |
                                  (uint)(SUB321(auVar77 >> 0xcf,0) & 1) << 0x19 |
                                  (uint)(SUB321(auVar77 >> 0xd7,0) & 1) << 0x1a |
                                  (uint)(SUB321(auVar77 >> 0xdf,0) & 1) << 0x1b |
                                  (uint)(SUB321(auVar77 >> 0xe7,0) & 1) << 0x1c |
                                  (uint)(SUB321(auVar77 >> 0xef,0) & 1) << 0x1d |
                                  (uint)(SUB321(auVar77 >> 0xf7,0) & 1) << 0x1e |
                                  (uint)(byte)(auVar77[0x1f] >> 7) << 0x1f);
      uVar27 = (ulong)((uint)(uVar20 >> 0x10) & 0xff);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar20 >> 0x18 & 0xff) * 8);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
      auVar45 = vpunpcklqdq_avx(auVar73,auVar48);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar20 >> 8) & 0xff) * 8)
      ;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar20 & 0xff) * 8);
      auVar4 = vpunpcklqdq_avx(auVar62,auVar55);
      auVar50._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar4;
      auVar50._16_16_ = ZEXT116(1) * auVar45;
      auVar46 = vpaddb_avx2(auVar50,auVar31);
      auVar46 = vpshufb_avx2(auVar51,auVar46);
      auVar51._0_16_ =
           ZEXT116(0) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            ) + ZEXT116(1) *
                *(undefined1 (*) [16])
                 (internal::pshufb_combine_table +
                 (ulong)(byte)internal::BitsSetTable256mul2[uVar20 & 0xff] * 8);
      auVar51._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            );
      auVar46 = vpshufb_avx2(auVar46,auVar51);
      *(undefined1 (*) [16])(*pauVar26 + lVar16) = auVar46._0_16_;
      *(undefined1 (*) [16])
       ((long)pauVar26 + (lVar16 - (ulong)(uint)POPCOUNT((uint)uVar20 & 0xffff)) + 0x10) =
           auVar46._16_16_;
      __dest = (undefined1 (*) [16])(*pauVar26 + POPCOUNT(~uVar20) + lVar16);
      lVar16 = lVar16 - (ulong)(uint)POPCOUNT((uint)uVar20);
      uVar27 = uVar20 >> 0x30 & 0xff;
      uVar3 = (uint)(uVar20 >> 0x20);
      uVar15 = uVar20 >> 0x20 & 0xff;
      auVar77._0_16_ =
           ZEXT116(0) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            ) + ZEXT116(1) *
                *(undefined1 (*) [16])
                 (internal::pshufb_combine_table +
                 (ulong)(byte)internal::BitsSetTable256mul2[uVar15] * 8);
      auVar77._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            );
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar20 >> 0x38) * 8);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
      auVar45 = vpunpcklqdq_avx(auVar49,auVar45);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar3 >> 8 & 0xff) * 8);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar15 * 8);
      auVar4 = vpunpcklqdq_avx(auVar63,auVar56);
      auVar46._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar4;
      auVar46._16_16_ = ZEXT116(1) * auVar45;
      auVar46 = vpaddb_avx2(auVar46,auVar31);
      auVar46 = vpshufb_avx2(auVar1,auVar46);
      auVar46 = vpshufb_avx2(auVar46,auVar77);
      *(undefined1 (*) [16])((long)pauVar26 + lVar16 + 0x20) = auVar46._0_16_;
      *(undefined1 (*) [16])
       ((long)pauVar26 + (lVar16 - (ulong)(uint)POPCOUNT(uVar3 & 0xffff)) + 0x30) = auVar46._16_16_;
      uVar27 = (long)uVar28 >> 0x3f;
      uVar17 = uVar17 + 0x80;
      pauVar26 = __dest;
    } while (uVar17 < uVar21);
  }
  uVar21 = len - uVar17;
  if (uVar21 == 0) {
    uVar21 = 0;
  }
  else {
    local_d8 = 0x20;
    uStack_d7 = 0x20;
    uStack_d6 = 0x20;
    uStack_d5 = 0x20;
    uStack_d4 = 0x20;
    uStack_d3 = 0x20;
    uStack_d2 = 0x20;
    uStack_d1 = 0x20;
    uStack_d0 = 0x20;
    uStack_cf = 0x20;
    uStack_ce = 0x20;
    uStack_cd = 0x20;
    uStack_cc = 0x20;
    uStack_cb = 0x20;
    uStack_ca = 0x20;
    uStack_c9 = 0x20;
    uStack_c8 = 0x20;
    uStack_c7 = 0x20;
    uStack_c6 = 0x20;
    uStack_c5 = 0x20;
    uStack_c4 = 0x20;
    uStack_c3 = 0x20;
    uStack_c2 = 0x20;
    uStack_c1 = 0x20;
    uStack_c0 = 0x20;
    uStack_bf = 0x20;
    uStack_be = 0x20;
    uStack_bd = 0x20;
    uStack_bc = 0x20;
    uStack_bb = 0x20;
    uStack_ba = 0x20;
    uStack_b9 = 0x20;
    local_f8 = 0x20;
    uStack_f7 = 0x20;
    uStack_f6 = 0x20;
    uStack_f5 = 0x20;
    uStack_f4 = 0x20;
    uStack_f3 = 0x20;
    uStack_f2 = 0x20;
    uStack_f1 = 0x20;
    uStack_f0 = 0x20;
    uStack_ef = 0x20;
    uStack_ee = 0x20;
    uStack_ed = 0x20;
    uStack_ec = 0x20;
    uStack_eb = 0x20;
    uStack_ea = 0x20;
    uStack_e9 = 0x20;
    uStack_e8 = 0x20;
    uStack_e7 = 0x20;
    uStack_e6 = 0x20;
    uStack_e5 = 0x20;
    uStack_e4 = 0x20;
    uStack_e3 = 0x20;
    uStack_e2 = 0x20;
    uStack_e1 = 0x20;
    uStack_e0 = 0x20;
    uStack_df = 0x20;
    uStack_de = 0x20;
    uStack_dd = 0x20;
    uStack_dc = 0x20;
    uStack_db = 0x20;
    uStack_da = 0x20;
    uStack_d9 = 0x20;
    local_118 = 0x20;
    uStack_117 = 0x20;
    uStack_116 = 0x20;
    uStack_115 = 0x20;
    uStack_114 = 0x20;
    uStack_113 = 0x20;
    uStack_112 = 0x20;
    uStack_111 = 0x20;
    uStack_110 = 0x20;
    uStack_10f = 0x20;
    uStack_10e = 0x20;
    uStack_10d = 0x20;
    uStack_10c = 0x20;
    uStack_10b = 0x20;
    uStack_10a = 0x20;
    uStack_109 = 0x20;
    uStack_108 = 0x20;
    uStack_107 = 0x20;
    uStack_106 = 0x20;
    uStack_105 = 0x20;
    uStack_104 = 0x20;
    uStack_103 = 0x20;
    uStack_102 = 0x20;
    uStack_101 = 0x20;
    uStack_100 = 0x20;
    uStack_ff = 0x20;
    uStack_fe = 0x20;
    uStack_fd = 0x20;
    uStack_fc = 0x20;
    uStack_fb = 0x20;
    uStack_fa = 0x20;
    uStack_f9 = 0x20;
    local_138 = 0x20;
    uStack_137 = 0x20;
    uStack_136 = 0x20;
    uStack_135 = 0x20;
    uStack_134 = 0x20;
    uStack_133 = 0x20;
    uStack_132 = 0x20;
    uStack_131 = 0x20;
    uStack_130 = 0x20;
    uStack_12f = 0x20;
    uStack_12e = 0x20;
    uStack_12d = 0x20;
    uStack_12c = 0x20;
    uStack_12b = 0x20;
    uStack_12a = 0x20;
    uStack_129 = 0x20;
    uStack_128 = 0x20;
    uStack_127 = 0x20;
    uStack_126 = 0x20;
    uStack_125 = 0x20;
    uStack_124 = 0x20;
    uStack_123 = 0x20;
    uStack_122 = 0x20;
    uStack_121 = 0x20;
    uStack_120 = 0x20;
    uStack_11f = 0x20;
    uStack_11e = 0x20;
    uStack_11d = 0x20;
    uStack_11c = 0x20;
    uStack_11b = 0x20;
    uStack_11a = 0x20;
    uStack_119 = 0x20;
    memcpy(&local_138,buf + uVar17,uVar21);
  }
  if (uVar21 != 0) {
    auVar1[1] = uStack_137;
    auVar1[0] = local_138;
    auVar1[2] = uStack_136;
    auVar1[3] = uStack_135;
    auVar1[4] = uStack_134;
    auVar1[5] = uStack_133;
    auVar1[6] = uStack_132;
    auVar1[7] = uStack_131;
    auVar1[8] = uStack_130;
    auVar1[9] = uStack_12f;
    auVar1[10] = uStack_12e;
    auVar1[0xb] = uStack_12d;
    auVar1[0xc] = uStack_12c;
    auVar1[0xd] = uStack_12b;
    auVar1[0xe] = uStack_12a;
    auVar1[0xf] = uStack_129;
    auVar1[0x10] = uStack_128;
    auVar1[0x11] = uStack_127;
    auVar1[0x12] = uStack_126;
    auVar1[0x13] = uStack_125;
    auVar1[0x14] = uStack_124;
    auVar1[0x15] = uStack_123;
    auVar1[0x16] = uStack_122;
    auVar1[0x17] = uStack_121;
    auVar1[0x18] = uStack_120;
    auVar1[0x19] = uStack_11f;
    auVar1[0x1a] = uStack_11e;
    auVar1[0x1b] = uStack_11d;
    auVar1[0x1c] = uStack_11c;
    auVar1[0x1d] = uStack_11b;
    auVar1[0x1e] = uStack_11a;
    auVar1[0x1f] = uStack_119;
    auVar2[1] = uStack_117;
    auVar2[0] = local_118;
    auVar2[2] = uStack_116;
    auVar2[3] = uStack_115;
    auVar2[4] = uStack_114;
    auVar2[5] = uStack_113;
    auVar2[6] = uStack_112;
    auVar2[7] = uStack_111;
    auVar2[8] = uStack_110;
    auVar2[9] = uStack_10f;
    auVar2[10] = uStack_10e;
    auVar2[0xb] = uStack_10d;
    auVar2[0xc] = uStack_10c;
    auVar2[0xd] = uStack_10b;
    auVar2[0xe] = uStack_10a;
    auVar2[0xf] = uStack_109;
    auVar2[0x10] = uStack_108;
    auVar2[0x11] = uStack_107;
    auVar2[0x12] = uStack_106;
    auVar2[0x13] = uStack_105;
    auVar2[0x14] = uStack_104;
    auVar2[0x15] = uStack_103;
    auVar2[0x16] = uStack_102;
    auVar2[0x17] = uStack_101;
    auVar2[0x18] = uStack_100;
    auVar2[0x19] = uStack_ff;
    auVar2[0x1a] = uStack_fe;
    auVar2[0x1b] = uStack_fd;
    auVar2[0x1c] = uStack_fc;
    auVar2[0x1d] = uStack_fb;
    auVar2[0x1e] = uStack_fa;
    auVar2[0x1f] = uStack_f9;
    auVar13[1] = uStack_f7;
    auVar13[0] = local_f8;
    auVar13[2] = uStack_f6;
    auVar13[3] = uStack_f5;
    auVar13[4] = uStack_f4;
    auVar13[5] = uStack_f3;
    auVar13[6] = uStack_f2;
    auVar13[7] = uStack_f1;
    auVar13[8] = uStack_f0;
    auVar13[9] = uStack_ef;
    auVar13[10] = uStack_ee;
    auVar13[0xb] = uStack_ed;
    auVar13[0xc] = uStack_ec;
    auVar13[0xd] = uStack_eb;
    auVar13[0xe] = uStack_ea;
    auVar13[0xf] = uStack_e9;
    auVar13[0x10] = uStack_e8;
    auVar13[0x11] = uStack_e7;
    auVar13[0x12] = uStack_e6;
    auVar13[0x13] = uStack_e5;
    auVar13[0x14] = uStack_e4;
    auVar13[0x15] = uStack_e3;
    auVar13[0x16] = uStack_e2;
    auVar13[0x17] = uStack_e1;
    auVar13[0x18] = uStack_e0;
    auVar13[0x19] = uStack_df;
    auVar13[0x1a] = uStack_de;
    auVar13[0x1b] = uStack_dd;
    auVar13[0x1c] = uStack_dc;
    auVar13[0x1d] = uStack_db;
    auVar13[0x1e] = uStack_da;
    auVar13[0x1f] = uStack_d9;
    auVar14[1] = uStack_d7;
    auVar14[0] = local_d8;
    auVar14[2] = uStack_d6;
    auVar14[3] = uStack_d5;
    auVar14[4] = uStack_d4;
    auVar14[5] = uStack_d3;
    auVar14[6] = uStack_d2;
    auVar14[7] = uStack_d1;
    auVar14[8] = uStack_d0;
    auVar14[9] = uStack_cf;
    auVar14[10] = uStack_ce;
    auVar14[0xb] = uStack_cd;
    auVar14[0xc] = uStack_cc;
    auVar14[0xd] = uStack_cb;
    auVar14[0xe] = uStack_ca;
    auVar14[0xf] = uStack_c9;
    auVar14[0x10] = uStack_c8;
    auVar14[0x11] = uStack_c7;
    auVar14[0x12] = uStack_c6;
    auVar14[0x13] = uStack_c5;
    auVar14[0x14] = uStack_c4;
    auVar14[0x15] = uStack_c3;
    auVar14[0x16] = uStack_c2;
    auVar14[0x17] = uStack_c1;
    auVar14[0x18] = uStack_c0;
    auVar14[0x19] = uStack_bf;
    auVar14[0x1a] = uStack_be;
    auVar14[0x1b] = uStack_bd;
    auVar14[0x1c] = uStack_bc;
    auVar14[0x1d] = uStack_bb;
    auVar14[0x1e] = uStack_ba;
    auVar14[0x1f] = uStack_b9;
    auVar40[8] = 0x5c;
    auVar40._0_8_ = 0x5c5c5c5c5c5c5c5c;
    auVar40[9] = 0x5c;
    auVar40[10] = 0x5c;
    auVar40[0xb] = 0x5c;
    auVar40[0xc] = 0x5c;
    auVar40[0xd] = 0x5c;
    auVar40[0xe] = 0x5c;
    auVar40[0xf] = 0x5c;
    auVar40[0x10] = 0x5c;
    auVar40[0x11] = 0x5c;
    auVar40[0x12] = 0x5c;
    auVar40[0x13] = 0x5c;
    auVar40[0x14] = 0x5c;
    auVar40[0x15] = 0x5c;
    auVar40[0x16] = 0x5c;
    auVar40[0x17] = 0x5c;
    auVar40[0x18] = 0x5c;
    auVar40[0x19] = 0x5c;
    auVar40[0x1a] = 0x5c;
    auVar40[0x1b] = 0x5c;
    auVar40[0x1c] = 0x5c;
    auVar40[0x1d] = 0x5c;
    auVar40[0x1e] = 0x5c;
    auVar40[0x1f] = 0x5c;
    auVar31 = vpcmpeqb_avx2(auVar1,auVar40);
    auVar29 = vpcmpeqb_avx2(auVar2,auVar40);
    uVar17 = CONCAT44((uint)(SUB321(auVar29 >> 7,0) & 1) | (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f,
                      (uint)(SUB321(auVar31 >> 7,0) & 1) | (uint)(SUB321(auVar31 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar31 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar31 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar31 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar31 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar31 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar31 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar31 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar31 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar31 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar31 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar31 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar31 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar31 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar31 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar31 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar31 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar31 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar31 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar31 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar31 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar31 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar31 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar31 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar31 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar31 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar31 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar31 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar31 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar31 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar31[0x1f] >> 7) << 0x1f);
    if (uVar17 == 0) {
      uVar17 = 0;
    }
    else {
      uVar15 = ~local_170 & uVar17;
      uVar20 = ~(uVar15 * 2) & uVar17 & 0xaaaaaaaaaaaaaaaa;
      uVar17 = (ulong)CARRY8(uVar20,uVar15);
      local_170 = ((uVar20 + uVar15) * 2 ^ 0x5555555555555555) & local_170 + uVar15 * 2;
    }
    auVar43[8] = 0x22;
    auVar43._0_8_ = 0x2222222222222222;
    auVar43[9] = 0x22;
    auVar43[10] = 0x22;
    auVar43[0xb] = 0x22;
    auVar43[0xc] = 0x22;
    auVar43[0xd] = 0x22;
    auVar43[0xe] = 0x22;
    auVar43[0xf] = 0x22;
    auVar43[0x10] = 0x22;
    auVar43[0x11] = 0x22;
    auVar43[0x12] = 0x22;
    auVar43[0x13] = 0x22;
    auVar43[0x14] = 0x22;
    auVar43[0x15] = 0x22;
    auVar43[0x16] = 0x22;
    auVar43[0x17] = 0x22;
    auVar43[0x18] = 0x22;
    auVar43[0x19] = 0x22;
    auVar43[0x1a] = 0x22;
    auVar43[0x1b] = 0x22;
    auVar43[0x1c] = 0x22;
    auVar43[0x1d] = 0x22;
    auVar43[0x1e] = 0x22;
    auVar43[0x1f] = 0x22;
    auVar31 = vpcmpeqb_avx2(auVar1,auVar43);
    auVar29 = vpcmpeqb_avx2(auVar2,auVar43);
    auVar32 = vpcmpeqd_avx(auVar29._0_16_,auVar29._0_16_);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = ~local_170 &
                   CONCAT44((uint)(SUB321(auVar29 >> 7,0) & 1) |
                            (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                            (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                            (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                            (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                            (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                            (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                            (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                            (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                            (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                            (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                            (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                            (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                            (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                            (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                            (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                            (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                            (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                            (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                            (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                            (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                            (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                            (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                            (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                            (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                            (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                            (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                            (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                            (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                            (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                            (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                            (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f,
                            (uint)(SUB321(auVar31 >> 7,0) & 1) |
                            (uint)(SUB321(auVar31 >> 0xf,0) & 1) << 1 |
                            (uint)(SUB321(auVar31 >> 0x17,0) & 1) << 2 |
                            (uint)(SUB321(auVar31 >> 0x1f,0) & 1) << 3 |
                            (uint)(SUB321(auVar31 >> 0x27,0) & 1) << 4 |
                            (uint)(SUB321(auVar31 >> 0x2f,0) & 1) << 5 |
                            (uint)(SUB321(auVar31 >> 0x37,0) & 1) << 6 |
                            (uint)(SUB321(auVar31 >> 0x3f,0) & 1) << 7 |
                            (uint)(SUB321(auVar31 >> 0x47,0) & 1) << 8 |
                            (uint)(SUB321(auVar31 >> 0x4f,0) & 1) << 9 |
                            (uint)(SUB321(auVar31 >> 0x57,0) & 1) << 10 |
                            (uint)(SUB321(auVar31 >> 0x5f,0) & 1) << 0xb |
                            (uint)(SUB321(auVar31 >> 0x67,0) & 1) << 0xc |
                            (uint)(SUB321(auVar31 >> 0x6f,0) & 1) << 0xd |
                            (uint)(SUB321(auVar31 >> 0x77,0) & 1) << 0xe |
                            (uint)SUB321(auVar31 >> 0x7f,0) << 0xf |
                            (uint)(SUB321(auVar31 >> 0x87,0) & 1) << 0x10 |
                            (uint)(SUB321(auVar31 >> 0x8f,0) & 1) << 0x11 |
                            (uint)(SUB321(auVar31 >> 0x97,0) & 1) << 0x12 |
                            (uint)(SUB321(auVar31 >> 0x9f,0) & 1) << 0x13 |
                            (uint)(SUB321(auVar31 >> 0xa7,0) & 1) << 0x14 |
                            (uint)(SUB321(auVar31 >> 0xaf,0) & 1) << 0x15 |
                            (uint)(SUB321(auVar31 >> 0xb7,0) & 1) << 0x16 |
                            (uint)SUB321(auVar31 >> 0xbf,0) << 0x17 |
                            (uint)(SUB321(auVar31 >> 199,0) & 1) << 0x18 |
                            (uint)(SUB321(auVar31 >> 0xcf,0) & 1) << 0x19 |
                            (uint)(SUB321(auVar31 >> 0xd7,0) & 1) << 0x1a |
                            (uint)(SUB321(auVar31 >> 0xdf,0) & 1) << 0x1b |
                            (uint)(SUB321(auVar31 >> 0xe7,0) & 1) << 0x1c |
                            (uint)(SUB321(auVar31 >> 0xef,0) & 1) << 0x1d |
                            (uint)(SUB321(auVar31 >> 0xf7,0) & 1) << 0x1e |
                            (uint)(byte)(auVar31[0x1f] >> 7) << 0x1f);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar32._0_8_;
    auVar45 = (undefined1  [16])0x0;
    for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
      if ((auVar6 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
        auVar45 = auVar45 ^ auVar10 << uVar3;
      }
    }
    uVar27 = auVar45._0_8_ ^ uVar27;
    auVar52._16_16_ = _DAT_00190140;
    auVar52._0_16_ = _DAT_00190140;
    auVar31 = vpshufb_avx2(auVar52,auVar1);
    auVar29 = vpshufb_avx2(auVar52,auVar2);
    auVar31 = vpcmpeqb_avx2(auVar31,auVar1);
    auVar29 = vpcmpeqb_avx2(auVar29,auVar2);
    auVar30 = vpcmpeqb_avx2(auVar13,auVar40);
    auVar36 = vpcmpeqb_avx2(auVar14,auVar40);
    uVar15 = CONCAT44((uint)(SUB321(auVar36 >> 7,0) & 1) | (uint)(SUB321(auVar36 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar36 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar36 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar36 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar36 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar36 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar36 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar36 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar36 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar36 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar36 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar36 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar36 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar36 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar36 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar36 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar36 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar36 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar36 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar36 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar36 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar36 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar36 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar36 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar36 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar36 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar36 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar36 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar36 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar36 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar36[0x1f] >> 7) << 0x1f,
                      (uint)(SUB321(auVar30 >> 7,0) & 1) | (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    if (uVar15 != 0) {
      uVar20 = ~uVar17 & uVar15;
      uVar17 = (((~(uVar20 * 2) & uVar15 & 0x2aaaaaaaaaaaaaaa) + uVar20) * 2 ^ 0x5555555555555555) &
               uVar17 + uVar20 * 2;
    }
    auVar30 = vpcmpeqb_avx2(auVar13,auVar43);
    auVar36 = vpcmpeqb_avx2(auVar14,auVar43);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = ~uVar17 & CONCAT44((uint)(SUB321(auVar36 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar36 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar36 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar36 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar36 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar36 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar36 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar36 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar36 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar36 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar36 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar36 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar36 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar36 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar36 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar36 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar36 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar36 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar36 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar36 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar36 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar36 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar36 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar36 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar36 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar36 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar36 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar36 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar36 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar36 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar36 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar36[0x1f] >> 7) << 0x1f,
                                      (uint)(SUB321(auVar30 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = auVar32._0_8_;
    auVar32 = (undefined1  [16])0x0;
    for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
      if ((auVar7 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
        auVar32 = auVar32 ^ auVar11 << uVar3;
      }
    }
    uVar28 = auVar32._0_8_ ^ (long)uVar27 >> 0x3f;
    auVar30 = vpshufb_avx2(auVar52,auVar13);
    auVar36 = vpshufb_avx2(auVar52,auVar14);
    auVar30 = vpcmpeqb_avx2(auVar13,auVar30);
    auVar36 = vpcmpeqb_avx2(auVar14,auVar36);
    uVar23 = ~uVar27 & CONCAT44((uint)(SUB321(auVar29 >> 7,0) & 1) |
                                (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f,
                                (uint)(SUB321(auVar31 >> 7,0) & 1) |
                                (uint)(SUB321(auVar31 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar31 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar31 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar31 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar31 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar31 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar31 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar31 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar31 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar31 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar31 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar31 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar31 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar31 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar31 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar31 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar31 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar31 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar31 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar31 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar31 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar31 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar31 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar31 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar31 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar31 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar31 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar31 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar31 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar31 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar31[0x1f] >> 7) << 0x1f);
    uVar15 = (ulong)((uint)(uVar23 >> 0x10) & 0xff);
    auVar41._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar15] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table +
            (ulong)(byte)internal::BitsSetTable256mul2[uVar23 & 0xff] * 8);
    auVar41._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar15] * 8);
    uVar25 = uVar23 >> 0x30 & 0xff;
    uVar17 = uVar23 >> 0x20 & 0xff;
    auVar44._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar25] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar17] * 8
            );
    auVar44._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar25] * 8);
    uVar24 = ~uVar28 & CONCAT44((uint)(SUB321(auVar36 >> 7,0) & 1) |
                                (uint)(SUB321(auVar36 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar36 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar36 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar36 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar36 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar36 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar36 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar36 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar36 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar36 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar36 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar36 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar36 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar36 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar36 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar36 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar36 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar36 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar36 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar36 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar36 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar36 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar36 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar36 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar36 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar36 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar36 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar36 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar36 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar36 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar36[0x1f] >> 7) << 0x1f,
                                (uint)(SUB321(auVar30 >> 7,0) & 1) |
                                (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    uVar18 = (ulong)((uint)(uVar24 >> 0x10) & 0xff);
    auVar47._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar18] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table +
            (ulong)(byte)internal::BitsSetTable256mul2[uVar24 & 0xff] * 8);
    auVar47._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar18] * 8);
    uVar27 = uVar24 >> 0x30 & 0xff;
    uVar20 = uVar24 >> 0x20 & 0xff;
    auVar53._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar20] * 8
            );
    auVar53._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar23 >> 0x18 & 0xff) * 8);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar15 * 8);
    auVar32 = vpunpcklqdq_avx(auVar64,auVar57);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar23 >> 8) & 0xff) * 8);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar23 & 0xff) * 8);
    auVar45 = vpunpcklqdq_avx(auVar80,auVar74);
    auVar69._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar45;
    auVar69._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
    auVar31 = vpaddb_avx2(auVar69,_DAT_00195280);
    auVar31 = vpshufb_avx2(auVar1,auVar31);
    auVar31 = vpshufb_avx2(auVar31,auVar41);
    local_b8 = auVar31._0_16_;
    *(undefined1 (*) [16])(auStack_a8 + -(ulong)(uint)POPCOUNT((uint)uVar23 & 0xffff)) =
         auVar31._16_16_;
    lVar16 = -(ulong)(uint)POPCOUNT((uint)uVar23);
    uVar3 = (uint)(uVar23 >> 0x20);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar23 >> 0x38) * 8);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar25 * 8);
    auVar32 = vpunpcklqdq_avx(auVar38,auVar34);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar3 >> 8 & 0xff) * 8);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar17 * 8);
    auVar45 = vpunpcklqdq_avx(auVar75,auVar65);
    auVar37._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar45;
    auVar37._16_16_ = ZEXT116(1) * auVar32;
    auVar31 = vpaddb_avx2(_DAT_00195280,auVar37);
    auVar31 = vpshufb_avx2(auVar2,auVar31);
    auVar31 = vpshufb_avx2(auVar31,auVar44);
    *(undefined1 (*) [16])(auStack_98 + lVar16) = auVar31._0_16_;
    *(undefined1 (*) [16])(auStack_88 + (lVar16 - (ulong)(uint)POPCOUNT(uVar3 & 0xffff))) =
         auVar31._16_16_;
    uVar3 = (uint)(uVar24 >> 0x20);
    uVar17 = *(ulong *)(internal::thintable_epi8 + (uVar24 >> 0x38) * 8);
    uVar27 = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
    uVar15 = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar3 >> 8 & 0xff) * 8);
    pauVar26 = (undefined1 (*) [16])(local_b8 + POPCOUNT(~uVar23));
    uVar20 = *(ulong *)(internal::thintable_epi8 + uVar20 * 8);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar24 >> 0x18 & 0xff) * 8);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar18 * 8);
    auVar32 = vpunpcklqdq_avx(auVar35,auVar32);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar24 >> 8) & 0xff) * 8);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar24 & 0xff) * 8);
    auVar45 = vpunpcklqdq_avx(auVar42,auVar39);
    auVar33._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar45;
    auVar33._16_16_ = ZEXT116(1) * auVar32;
    auVar31 = vpaddb_avx2(_DAT_00195280,auVar33);
    auVar31 = vpshufb_avx2(auVar13,auVar31);
    auVar31 = vpshufb_avx2(auVar31,auVar47);
    *pauVar26 = auVar31._0_16_;
    *(undefined1 (*) [16])((long)pauVar26 + (0x10 - (ulong)(uint)POPCOUNT((uint)uVar24 & 0xffff))) =
         auVar31._16_16_;
    uVar22 = POPCOUNT((uint)uVar24);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar17;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar27;
    auVar32 = vpunpcklqdq_avx(auVar76,auVar66);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar15;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar20;
    auVar45 = vpunpcklqdq_avx(auVar82,auVar81);
    auVar31._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar45;
    auVar31._16_16_ = ZEXT116(1) * auVar32;
    auVar31 = vpaddb_avx2(_DAT_00195280,auVar31);
    auVar31 = vpshufb_avx2(auVar14,auVar31);
    auVar31 = vpshufb_avx2(auVar31,auVar53);
    *(undefined1 (*) [16])((long)pauVar26 + (0x20 - (ulong)uVar22)) = auVar31._0_16_;
    *(undefined1 (*) [16])
     ((long)pauVar26 + (-(ulong)(uint)POPCOUNT(uVar3 & 0xffff) - (ulong)uVar22) + 0x30) =
         auVar31._16_16_;
    uVar17 = POPCOUNT(~uVar24) + POPCOUNT(~uVar23);
    uVar27 = (long)uVar28 >> 0x3f;
    if (uVar21 <= uVar17) {
      uVar17 = uVar21;
    }
    memcpy(__dest,local_b8,uVar17);
    __dest = (undefined1 (*) [16])(*__dest + uVar17);
  }
  sVar19 = 0;
  eVar12 = UNCLOSED_STRING;
  if (uVar27 == 0) {
    sVar19 = (long)__dest - (long)dst;
    eVar12 = SUCCESS;
  }
  *dst_len = sVar19;
  return eVar12;
}

Assistant:

simdjson_warn_unused error_code implementation::minify(const uint8_t *buf, size_t len, uint8_t *dst, size_t &dst_len) const noexcept {
  return haswell::stage1::json_minifier::minify<128>(buf, len, dst, dst_len);
}